

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesWidget.cxx
# Opt level: O0

void __thiscall cmCursesWidget::~cmCursesWidget(cmCursesWidget *this)

{
  cmCursesWidget *this_local;
  
  this->_vptr_cmCursesWidget = (_func_int **)&PTR__cmCursesWidget_00f4a9c8;
  if (this->Field != (FIELD *)0x0) {
    free_field(this->Field);
    this->Field = (FIELD *)0x0;
  }
  std::__cxx11::string::~string((string *)&this->Value);
  return;
}

Assistant:

cmCursesWidget::~cmCursesWidget()
{
  if (this->Field) {
    free_field(this->Field);
    this->Field = nullptr;
  }
}